

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

bool __thiscall BCLog::Logger::Enabled(Logger *this)

{
  long lVar1;
  bool bVar2;
  long in_RDI;
  long in_FS_OFFSET;
  StdLockGuard scoped_lock;
  list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  *in_stack_ffffffffffffffc8;
  undefined1 local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  StdLockGuard::StdLockGuard((StdLockGuard *)in_stack_ffffffffffffffc8,(StdMutex *)0x70027f);
  local_19 = 1;
  if ((((*(byte *)(in_RDI + 0x48) & 1) == 0) && (local_19 = 1, (*(byte *)(in_RDI + 0xd0) & 1) == 0))
     && (local_19 = 1, (*(byte *)(in_RDI + 0xd1) & 1) == 0)) {
    bVar2 = std::__cxx11::
            list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
            ::empty(in_stack_ffffffffffffffc8);
    local_19 = bVar2 ^ 0xff;
  }
  StdLockGuard::~StdLockGuard((StdLockGuard *)in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(local_19 & 1);
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_cs)
        {
            StdLockGuard scoped_lock(m_cs);
            return m_buffering || m_print_to_console || m_print_to_file || !m_print_callbacks.empty();
        }